

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_clamp_ivec2(ShaderEvalContext *c)

{
  int iVar1;
  ulong uVar2;
  int i;
  long lVar3;
  int iVar4;
  Vector<int,_2> res_2;
  Vector<int,_2> res_1;
  Vector<int,_2> res;
  Vector<int,_2> res_3;
  Vector<float,_2> res_4;
  float local_28 [2];
  ulong local_20;
  ulong local_18 [2];
  int local_8 [2];
  
  local_28[0] = c->in[0].m_data[3];
  local_28[1] = c->in[0].m_data[1];
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  lVar3 = 0;
  do {
    res.m_data[lVar3] = (int)local_28[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  uVar2 = *(ulong *)c->in[1].m_data;
  local_18[0] = uVar2 << 0x20 | uVar2 >> 0x20;
  res_1.m_data[0] = 0;
  res_1.m_data[1] = 0;
  lVar3 = 0;
  do {
    res_1.m_data[lVar3] = (int)*(float *)((long)local_18 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  uVar2 = *(ulong *)(c->in[2].m_data + 1);
  local_20 = uVar2 << 0x20 | uVar2 >> 0x20;
  res_2.m_data[0] = 0;
  res_2.m_data[1] = 0;
  lVar3 = 0;
  do {
    res_2.m_data[lVar3] = (int)*(float *)((long)local_18 + lVar3 * 4 + -8);
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  res_3.m_data[0] = 0;
  res_3.m_data[1] = 0;
  lVar3 = 0;
  do {
    iVar1 = res.m_data[lVar3];
    iVar4 = res_2.m_data[lVar3];
    if (iVar1 < res_2.m_data[lVar3]) {
      iVar4 = iVar1;
    }
    if (iVar1 < res_1.m_data[lVar3]) {
      iVar4 = res_1.m_data[lVar3];
    }
    res_3.m_data[lVar3] = iVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  res_4.m_data[0] = 0.0;
  res_4.m_data[1] = 0.0;
  lVar3 = 0;
  do {
    res_4.m_data[lVar3] = (float)res_3.m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  local_8[0] = 1;
  local_8[1] = 2;
  lVar3 = 0;
  do {
    (c->color).m_data[local_8[lVar3]] = res_4.m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }